

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O1

void __thiscall string_udls_Test::~string_udls_Test(string_udls_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(string, udls)
{
    using namespace ST::literals;

    // Only need to test the UDL usage -- the rest is covered above
    EXPECT_EQ(ST_LITERAL(""), ""_st);
    EXPECT_EQ(ST_LITERAL("Test"), "Test"_st);
    EXPECT_EQ(ST_LITERAL("Test"), L"Test"_st);
    EXPECT_EQ(ST_LITERAL("Test"), u"Test"_st);
    EXPECT_EQ(ST_LITERAL("Test"), U"Test"_st);
#ifdef ST_HAVE_CXX20_CHAR8_TYPES
    EXPECT_EQ(ST_LITERAL("Test"), u8"Test"_st);
#endif
}